

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall
QMdi::SimpleCascader::rearrange(SimpleCascader *this,QList<QWidget_*> *widgets,QRect *domain)

{
  int iVar1;
  int iVar2;
  long lVar3;
  QWidget *this_00;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  LayoutDirection direction;
  QStyle *pQVar9;
  long lVar10;
  undefined8 uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int index;
  long in_FS_OFFSET;
  bool bVar16;
  int local_fc;
  QRect local_d0;
  QFontMetrics fontMetrics;
  QRect local_b8;
  QStyleOptionTitleBar options;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  if ((widgets->d).size != 0) {
    options.icon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    options._104_8_ = &DAT_aaaaaaaaaaaaaaaa;
    options.text.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    options.text.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
    options.text.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex.super_QStyleOption.styleObject =
         (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex.super_QStyleOption.palette.d =
         (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    options.super_QStyleOptionComplex.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionTitleBar::QStyleOptionTitleBar(&options);
    QStyleOption::initFrom((QStyleOption *)&options,*(widgets->d).ptr);
    pQVar9 = QWidget::style(*(widgets->d).ptr);
    iVar4 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x1a,&options,*(widgets->d).ptr);
    _fontMetrics = &DAT_aaaaaaaaaaaaaaaa;
    QApplication::font((QApplication *)&local_b8,"QMdiSubWindowTitleBar");
    QFontMetrics::QFontMetrics(&fontMetrics,(QFont *)&local_b8);
    QFont::~QFont((QFont *)&local_b8);
    iVar5 = QFontMetrics::height();
    iVar4 = (iVar4 - iVar5) / -2 + iVar4;
    if (iVar4 < 2) {
      iVar4 = 1;
    }
    pQVar9 = QWidget::style(*(widgets->d).ptr);
    iVar15 = 0;
    iVar6 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x40,0,*(widgets->d).ptr);
    iVar5 = (int)(widgets->d).size;
    iVar1 = (domain->x2).m_i;
    iVar7 = (((domain->y2).m_i - (domain->y1).m_i) + -0x31) / (iVar6 + iVar4);
    if (iVar7 < 2) {
      iVar7 = 1;
    }
    iVar13 = (iVar5 / iVar7 + 1) - (uint)(iVar5 % iVar7 == 0);
    if (iVar13 < 2) {
      iVar13 = 1;
    }
    iVar2 = (domain->x1).m_i;
    local_fc = -1;
    index = 0;
    for (; iVar15 != iVar7; iVar15 = iVar15 + 1) {
      iVar8 = iVar15 * (iVar6 + iVar4);
      iVar14 = iVar13;
      iVar12 = local_fc;
      while (bVar16 = iVar14 != 0, iVar14 = iVar14 + -1, bVar16) {
        bVar16 = sanityCheck(widgets,index,"SimpleCascader");
        if (bVar16) {
          lVar10 = (long)index;
          index = index + 1;
          this_00 = (widgets->d).ptr[lVar10];
          local_b8.x1.m_i = -0x55555556;
          local_b8.y1.m_i = -0x55555556;
          local_b8.x2.m_i = -0x55555556;
          local_b8.y2.m_i = -0x55555556;
          uVar11 = (**(code **)(*(long *)this_00 + 0x70))(this_00);
          local_b8.x2.m_i = (int)uVar11 + iVar12;
          local_b8.y2.m_i = (int)((ulong)uVar11 >> 0x20) + iVar8 + -1;
          local_b8.x1.m_i = iVar12 + 1;
          local_b8.y1.m_i = iVar8;
          direction = QWidget::layoutDirection(this_00);
          local_d0 = QStyle::visualRect(direction,domain,&local_b8);
          QWidget::setGeometry(this_00,&local_d0);
          if (index == iVar5) goto LAB_0040a681;
        }
        iVar12 = iVar12 + ((iVar1 - iVar2) + -99) / iVar13;
      }
      local_fc = local_fc + 10;
    }
LAB_0040a681:
    QFontMetrics::~QFontMetrics(&fontMetrics);
    QStyleOptionTitleBar::~QStyleOptionTitleBar(&options);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SimpleCascader::rearrange(QList<QWidget *> &widgets, const QRect &domain) const
{
    if (widgets.isEmpty())
        return;

    // Tunables:
    const int topOffset = 0;
    const int bottomOffset = 50;
    const int leftOffset = 0;
    const int rightOffset = 100;
    const int dx = 10;

    QStyleOptionTitleBar options;
    options.initFrom(widgets.at(0));
    int titleBarHeight = widgets.at(0)->style()->pixelMetric(QStyle::PM_TitleBarHeight, &options, widgets.at(0));
    const QFontMetrics fontMetrics = QFontMetrics(QApplication::font("QMdiSubWindowTitleBar"));
    const int dy = qMax(titleBarHeight - (titleBarHeight - fontMetrics.height()) / 2, 1)
        + widgets.at(0)->style()->pixelMetric(QStyle::PM_FocusFrameVMargin, nullptr, widgets.at(0));

    const int n = widgets.size();
    const int nrows = qMax((domain.height() - (topOffset + bottomOffset)) / dy, 1);
    const int ncols = qMax(n / nrows + ((n % nrows) ? 1 : 0), 1);
    const int dcol = (domain.width() - (leftOffset + rightOffset)) / ncols;

    int i = 0;
    for (int row = 0; row < nrows; ++row) {
        for (int col = 0; col < ncols; ++col) {
            const int x = leftOffset + row * dx + col * dcol;
            const int y = topOffset + row * dy;
            if (!sanityCheck(widgets, i, "SimpleCascader"))
                continue;
            QWidget *widget = widgets.at(i++);
            QRect newGeometry = QRect(QPoint(x, y), widget->sizeHint());
            widget->setGeometry(QStyle::visualRect(widget->layoutDirection(), domain, newGeometry));
            if (i == n)
                return;
        }
    }
}